

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

SettingLookupResult __thiscall
duckdb::ClientContext::TryGetCurrentSetting(ClientContext *this,string *key,Value *result)

{
  SettingLookupResult SVar1;
  ConfigurationOption *pCVar2;
  const_iterator cVar3;
  DatabaseInstance *this_00;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  optional_ptr<const_duckdb::ConfigurationOption,_true> local_68;
  Value local_60;
  
  shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
  local_68 = DBConfig::GetOptionByName(key);
  if (local_68.ptr == (ConfigurationOption *)0x0) {
    cVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->config).set_variables._M_h,key);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
      SVar1 = DatabaseInstance::TryGetCurrentSetting(this_00,key,result);
      return (SettingLookupResult)SVar1.scope;
    }
    Value::operator=(result,(Value *)((long)cVar3.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                            ._M_cur + 0x28));
  }
  else {
    pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&local_68);
    (*pCVar2->get_setting)(&local_60,this);
    Value::operator=(result,&local_60);
    Value::~Value(&local_60);
  }
  return (SettingLookupResult)LOCAL;
}

Assistant:

SettingLookupResult ClientContext::TryGetCurrentSetting(const std::string &key, Value &result) const {
	// first check the built-in settings
	auto &db_config = DBConfig::GetConfig(*this);
	auto option = db_config.GetOptionByName(key);
	if (option) {
		result = option->get_setting(*this);
		return SettingLookupResult(SettingScope::LOCAL);
	}

	// check the client session values
	const auto &session_config_map = config.set_variables;

	auto session_value = session_config_map.find(key);
	bool found_session_value = session_value != session_config_map.end();
	if (found_session_value) {
		result = session_value->second;
		return SettingLookupResult(SettingScope::LOCAL);
	}
	// finally check the global session values
	return db->TryGetCurrentSetting(key, result);
}